

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

vector<mjs::value,_std::allocator<mjs::value>_> * __thiscall
mjs::interpreter::impl::eval_argument_list
          (vector<mjs::value,_std::allocator<mjs::value>_> *__return_storage_ptr__,impl *this,
          expression_list *es)

{
  bool bVar1;
  type e_00;
  value local_98;
  value local_70;
  reference local_48;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *e;
  const_iterator __end2;
  const_iterator __begin2;
  expression_list *__range2;
  expression_list *es_local;
  impl *this_local;
  vector<mjs::value,_std::allocator<mjs::value>_> *args;
  
  std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(__return_storage_ptr__);
  __end2 = std::
           vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
           ::begin(es);
  e = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
      std::
      vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
      ::end(es);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_*,_std::vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>_>
                                     *)&e), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_*,_std::vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>_>
               ::operator*(&__end2);
    e_00 = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                     (local_48);
    eval(&local_98,this,e_00);
    get_value(&local_70,this,&local_98);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::push_back
              (__return_storage_ptr__,&local_70);
    value::~value(&local_70);
    value::~value(&local_98);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_*,_std::vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<value> eval_argument_list(const expression_list& es) {
        std::vector<value> args;
        for (const auto& e: es) {
            args.push_back(get_value(eval(*e)));
        }
        return args;
    }